

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Class.cpp
# Opt level: O1

void __thiscall hdc::Class::Class(Class *this)

{
  ASTNode::ASTNode(&this->super_ASTNode);
  (this->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR_accept_00196e90;
  (this->name).lexem._M_dataplus._M_p = (pointer)&(this->name).lexem.field_2;
  (this->name).lexem._M_string_length = 0;
  (this->name).lexem.field_2._M_local_buf[0] = '\0';
  this->classVariableCounter = 0;
  this->methodCounter = 0;
  this->id = 0;
  this->globalId = 0;
  this->superClass = (NamedType *)0x0;
  this->file = (SourceFile *)0x0;
  this->destructor = (Def *)0x0;
  this->symbolTable = (SymbolTable *)0x0;
  this->selfType = (NamedType *)0x0;
  (this->variables).super__Vector_base<hdc::ClassVariable_*,_std::allocator<hdc::ClassVariable_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->variables).super__Vector_base<hdc::ClassVariable_*,_std::allocator<hdc::ClassVariable_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->variables).super__Vector_base<hdc::ClassVariable_*,_std::allocator<hdc::ClassVariable_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->methods).super__Vector_base<hdc::Def_*,_std::allocator<hdc::Def_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->methods).super__Vector_base<hdc::Def_*,_std::allocator<hdc::Def_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->methods).super__Vector_base<hdc::Def_*,_std::allocator<hdc::Def_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->constructors).super__Vector_base<hdc::Def_*,_std::allocator<hdc::Def_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->constructors).super__Vector_base<hdc::Def_*,_std::allocator<hdc::Def_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->constructors).super__Vector_base<hdc::Def_*,_std::allocator<hdc::Def_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ASTNode::setKind(&this->super_ASTNode,AST_CLASS);
  return;
}

Assistant:

Class::Class() {
    classVariableCounter = 0;
    methodCounter = 0;
    id = 0;
    globalId = 0;

    superClass = nullptr;
    file = nullptr;
    selfType = nullptr;
    destructor = nullptr;
    symbolTable = nullptr;

    setKind(AST_CLASS);
}